

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O0

int mbedtls_mpi_lset(mbedtls_mpi *X,mbedtls_mpi_sint z)

{
  int iVar1;
  mbedtls_mpi_uint mVar2;
  size_t in_RSI;
  mbedtls_mpi *in_RDI;
  int ret;
  
  iVar1 = mbedtls_mpi_grow(in_RDI,in_RSI);
  if (iVar1 == 0) {
    memset(in_RDI->p,0,(ulong)in_RDI->n << 3);
    mVar2 = mpi_sint_abs(in_RSI);
    *in_RDI->p = mVar2;
    in_RDI->s = (short)((long)in_RSI >> 0x3f) * 2 + 1;
  }
  return iVar1;
}

Assistant:

int mbedtls_mpi_lset(mbedtls_mpi *X, mbedtls_mpi_sint z)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(X, 1));
    memset(X->p, 0, X->n * ciL);

    X->p[0] = mpi_sint_abs(z);
    X->s    = TO_SIGN(z);

cleanup:

    return ret;
}